

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

void __thiscall
llm_graph_context::build_pooling
          (llm_graph_context *this,ggml_cgraph *gf,ggml_tensor *cls,ggml_tensor *cls_b,
          ggml_tensor *cls_out,ggml_tensor *cls_out_b)

{
  ggml_context *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *__args_1;
  char *pcVar3;
  undefined8 uVar4;
  
  if (this->cparams->embeddings != true) {
    return;
  }
  __args_1 = ((this->res)._M_t.
              super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
              super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
              super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd;
  if (__args_1 != (ggml_tensor *)0x0) {
    switch(this->pooling_type) {
    case LLAMA_POOLING_TYPE_NONE:
      break;
    case LLAMA_POOLING_TYPE_MEAN:
      pgVar2 = build_inp_mean(this);
      pgVar1 = this->ctx0;
      uVar4 = ggml_transpose(pgVar1,__args_1);
      uVar4 = ggml_cont(pgVar1,uVar4);
      __args_1 = (ggml_tensor *)ggml_mul_mat(pgVar1,uVar4,pgVar2);
      break;
    case LLAMA_POOLING_TYPE_CLS:
    case LLAMA_POOLING_TYPE_LAST:
      pgVar2 = build_inp_cls(this);
      __args_1 = (ggml_tensor *)ggml_get_rows(this->ctx0,__args_1,pgVar2);
      break;
    case LLAMA_POOLING_TYPE_RANK:
      pgVar2 = build_inp_cls(this);
      uVar4 = ggml_get_rows(this->ctx0,__args_1,pgVar2);
      if (cls == (ggml_tensor *)0x0) {
        pcVar3 = "cls != nullptr";
        uVar4 = 0x696;
      }
      else {
        if (cls_b != (ggml_tensor *)0x0) {
          pgVar1 = this->ctx0;
          uVar4 = ggml_mul_mat(pgVar1,cls,uVar4);
          uVar4 = ggml_add(pgVar1,uVar4,cls_b);
          __args_1 = (ggml_tensor *)ggml_tanh(this->ctx0,uVar4);
          if (cls_out != (ggml_tensor *)0x0) {
            if (cls_out_b == (ggml_tensor *)0x0) {
              pcVar3 = "cls_out_b != nullptr";
              uVar4 = 0x69f;
              goto LAB_001ad9b8;
            }
            pgVar1 = this->ctx0;
            uVar4 = ggml_mul_mat(pgVar1,cls_out,__args_1);
            __args_1 = (ggml_tensor *)ggml_add(pgVar1,uVar4,cls_out_b);
          }
          break;
        }
        pcVar3 = "cls_b != nullptr";
        uVar4 = 0x697;
      }
      goto LAB_001ad9b8;
    default:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x6a6,"unknown pooling type");
    }
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,__args_1,"result_embd_pooled",-1);
    }
    ((this->res)._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd_pooled = __args_1;
    ggml_build_forward_expand(gf,__args_1);
    return;
  }
  pcVar3 = "inp != nullptr && \"missing result_norm/result_embd tensor\"";
  uVar4 = 0x67b;
LAB_001ad9b8:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uVar4,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

void llm_graph_context::build_pooling(
        ggml_cgraph * gf,
        ggml_tensor * cls,
        ggml_tensor * cls_b,
        ggml_tensor * cls_out,
        ggml_tensor * cls_out_b) const {
    if (!cparams.embeddings) {
        return;
    }

    ggml_tensor * inp = res->t_embd;

    //// find result_norm tensor for input
    //for (int i = ggml_graph_n_nodes(gf) - 1; i >= 0; --i) {
    //    inp = ggml_graph_node(gf, i);
    //    if (strcmp(inp->name, "result_norm") == 0 || strcmp(inp->name, "result_embd") == 0) {
    //        break;
    //    }

    //    inp = nullptr;
    //}

    GGML_ASSERT(inp != nullptr && "missing result_norm/result_embd tensor");

    ggml_tensor * cur;

    switch (pooling_type) {
        case LLAMA_POOLING_TYPE_NONE:
            {
                cur = inp;
            } break;
        case LLAMA_POOLING_TYPE_MEAN:
            {
                ggml_tensor * inp_mean = build_inp_mean();
                cur = ggml_mul_mat(ctx0, ggml_cont(ctx0, ggml_transpose(ctx0, inp)), inp_mean);
            } break;
        case LLAMA_POOLING_TYPE_CLS:
        case LLAMA_POOLING_TYPE_LAST:
            {
                ggml_tensor * inp_cls = build_inp_cls();
                cur = ggml_get_rows(ctx0, inp, inp_cls);
            } break;
        case LLAMA_POOLING_TYPE_RANK:
            {
                ggml_tensor * inp_cls = build_inp_cls();
                inp = ggml_get_rows(ctx0, inp, inp_cls);

                // classification head
                // https://github.com/huggingface/transformers/blob/5af7d41e49bbfc8319f462eb45253dcb3863dfb7/src/transformers/models/roberta/modeling_roberta.py#L1566
                GGML_ASSERT(cls   != nullptr);
                GGML_ASSERT(cls_b != nullptr);

                cur = ggml_add (ctx0, ggml_mul_mat(ctx0, cls, inp), cls_b);
                cur = ggml_tanh(ctx0, cur);

                // some models don't have `cls_out`, for example: https://huggingface.co/jinaai/jina-reranker-v1-tiny-en
                // https://huggingface.co/jinaai/jina-reranker-v1-tiny-en/blob/cb5347e43979c3084a890e3f99491952603ae1b7/modeling_bert.py#L884-L896
                if (cls_out) {
                    GGML_ASSERT(cls_out_b != nullptr);

                    cur = ggml_add (ctx0, ggml_mul_mat(ctx0, cls_out, cur), cls_out_b);
                }
            } break;
        default:
            {
                GGML_ABORT("unknown pooling type");
            }
    }

    cb(cur, "result_embd_pooled", -1);
    res->t_embd_pooled = cur;

    ggml_build_forward_expand(gf, cur);
}